

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int CustomPut(VP8Io *io)

{
  void *pvVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((0 < io->mb_w) && (iVar2 = 0, 0 < io->mb_h)) {
    pvVar1 = io->opaque;
    iVar2 = (**(code **)((long)pvVar1 + 0x58))(io,pvVar1);
    if (*(code **)((long)pvVar1 + 0x60) != (code *)0x0) {
      (**(code **)((long)pvVar1 + 0x60))(io,pvVar1,iVar2);
    }
    *(int *)((long)pvVar1 + 0x20) = *(int *)((long)pvVar1 + 0x20) + iVar2;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int CustomPut(const VP8Io* io) {
  WebPDecParams* const p = (WebPDecParams*)io->opaque;
  const int mb_w = io->mb_w;
  const int mb_h = io->mb_h;
  int num_lines_out;
  assert(!(io->mb_y & 1));

  if (mb_w <= 0 || mb_h <= 0) {
    return 0;
  }
  num_lines_out = p->emit(io, p);
  if (p->emit_alpha != NULL) {
    p->emit_alpha(io, p, num_lines_out);
  }
  p->last_y += num_lines_out;
  return 1;
}